

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::AssertHelper::operator=(AssertHelper *this,Message *message)

{
  Type result_type;
  int line_number;
  AssertHelperData *pAVar1;
  char *file_name;
  UnitTest *this_00;
  UnitTest *this_01;
  UnitTestImpl *this_02;
  string local_58;
  string local_38;
  Message *local_18;
  Message *message_local;
  AssertHelper *this_local;
  
  local_18 = message;
  message_local = (Message *)this;
  this_00 = UnitTest::GetInstance();
  pAVar1 = this->data_;
  result_type = pAVar1->type;
  file_name = pAVar1->file;
  line_number = pAVar1->line;
  AppendUserMessage(&local_38,&pAVar1->message,local_18);
  this_01 = UnitTest::GetInstance();
  this_02 = UnitTest::impl(this_01);
  UnitTestImpl::CurrentOsStackTraceExceptTop_abi_cxx11_(&local_58,this_02,1);
  UnitTest::AddTestPartResult(this_00,result_type,file_name,line_number,&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void AssertHelper::operator=(const Message& message) const {
  UnitTest::GetInstance()->AddTestPartResult(
      data_->type, data_->file, data_->line,
      AppendUserMessage(data_->message, message),
      UnitTest::GetInstance()->impl()->CurrentOsStackTraceExceptTop(1)
      // Skips the stack frame for this function itself.
  );  // NOLINT
}